

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O2

void __thiscall
icu_63::FieldPositionIterator::setData
          (FieldPositionIterator *this,UVector32 *adopt,UErrorCode *status)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  UErrorCode UVar4;
  int32_t iVar5;
  
  UVar4 = *status;
  if (adopt != (UVector32 *)0x0 && UVar4 < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = adopt->count;
    if ((long)iVar2 != 0) {
      if (iVar2 % 3 == 0) {
        lVar3 = 1;
        do {
          if (iVar2 <= lVar3) goto LAB_0024e182;
          iVar5 = 0;
          if ((int)lVar3 + 1 < iVar2) {
            iVar5 = adopt->elements[lVar3 + 1];
          }
          piVar1 = adopt->elements + lVar3;
          lVar3 = lVar3 + 3;
        } while (*piVar1 < iVar5);
      }
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      goto LAB_0024e18b;
    }
    (*(adopt->super_UObject)._vptr_UObject[1])(adopt);
    UVar4 = *status;
    adopt = (UVector32 *)0x0;
  }
LAB_0024e182:
  if (UVar4 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->data != (UVector32 *)0x0) {
      (*(this->data->super_UObject)._vptr_UObject[1])();
    }
    this->data = adopt;
    this->pos = -(uint)(adopt == (UVector32 *)0x0);
  }
  else if (adopt != (UVector32 *)0x0) {
LAB_0024e18b:
    (*(adopt->super_UObject)._vptr_UObject[1])(adopt);
    return;
  }
  return;
}

Assistant:

void FieldPositionIterator::setData(UVector32 *adopt, UErrorCode& status) {
  // Verify that adopt has valid data, and update status if it doesn't.
  if (U_SUCCESS(status)) {
    if (adopt) {
      if (adopt->size() == 0) {
        delete adopt;
        adopt = NULL;
      } else if ((adopt->size() % 3) != 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
      } else {
        for (int i = 1; i < adopt->size(); i += 3) {
          if (adopt->elementAti(i) >= adopt->elementAti(i+1)) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
          }
        }
      }
    }
  }

  // We own the data, even if status is in error, so we need to delete it now
  // if we're not keeping track of it.
  if (!U_SUCCESS(status)) {
    delete adopt;
    return;
  }

  delete data;
  data = adopt;
  pos = adopt == NULL ? -1 : 0;
}